

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O0

SPIRType * __thiscall spirv_cross::Parser::set<spirv_cross::SPIRType>(Parser *this,uint32_t id)

{
  Variant *var_00;
  TypedID<(spirv_cross::Types)0> local_24;
  SPIRType *local_20;
  SPIRType *var;
  Parser *pPStack_10;
  uint32_t id_local;
  Parser *this_local;
  
  var._4_4_ = id;
  pPStack_10 = this;
  TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)&var,id);
  ParsedIR::add_typed_id(&this->ir,TypeType,var._0_4_);
  var_00 = VectorView<spirv_cross::Variant>::operator[]
                     (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)var._4_4_);
  local_20 = variant_set<spirv_cross::SPIRType>(var_00);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_24,var._4_4_);
  (local_20->super_IVariant).self.id = local_24.id;
  return local_20;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}